

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O2

void EpdNormalizeDecimal(EpDouble *epd)

{
  int iVar1;
  EpType val;
  double dVar2;
  
  dVar2 = (epd->type).value;
  if (((ulong)dVar2 & 0x8008000000000000) == 0x8000000000000 ||
      ((ulong)dVar2 & 0x7ff7ffffffffffff) != 0x7ff0000000000000) {
    iVar1 = EpdGetExponentDecimal(dVar2);
    dVar2 = pow(10.0,(double)iVar1);
    (epd->type).value = (epd->type).value / dVar2;
    epd->exponent = epd->exponent + iVar1;
  }
  else {
    epd->exponent = 0;
  }
  return;
}

Assistant:

void
EpdNormalizeDecimal(EpDouble *epd)
{
  int           exponent;

  if (IsNanOrInfDouble(epd->type.value)) {
    epd->exponent = 0;
    return;
  }

  exponent = EpdGetExponentDecimal(epd->type.value);
  epd->type.value /= pow((double)10.0, (double)exponent);
  epd->exponent += exponent;
}